

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall duckdb::Relation::Alias(Relation *this,string *alias)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::Relation,_true> sVar3;
  undefined1 local_49;
  shared_ptr<duckdb::SubqueryRelation,_true> local_48;
  enable_shared_from_this<duckdb::Relation> local_38;
  shared_ptr<duckdb::SubqueryRelation> local_28;
  
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_38);
  local_28.super___shared_ptr<duckdb::SubqueryRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::SubqueryRelation,std::allocator<duckdb::SubqueryRelation>,duckdb::shared_ptr<duckdb::Relation,true>,std::__cxx11::string_const&>
            (&local_28.super___shared_ptr<duckdb::SubqueryRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SubqueryRelation **)&local_28,
             (allocator<duckdb::SubqueryRelation> *)&local_49,
             (shared_ptr<duckdb::Relation,_true> *)&local_38,in_RDX);
  shared_ptr<duckdb::SubqueryRelation,_true>::shared_ptr(&local_48,&local_28);
  _Var2._M_pi = extraout_RDX;
  if (local_28.super___shared_ptr<duckdb::SubqueryRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<duckdb::SubqueryRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  _Var1._M_pi = local_48.internal.
                super___shared_ptr<duckdb::SubqueryRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_48.internal.super___shared_ptr<duckdb::SubqueryRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_48.internal.super___shared_ptr<duckdb::SubqueryRelation,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_48.internal.super___shared_ptr<duckdb::SubqueryRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  if (local_38.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Alias(const string &alias) {
	return make_shared_ptr<SubqueryRelation>(shared_from_this(), alias);
}